

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

parser<callbacks_proxy<mock_json_callbacks>_> * __thiscall
pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
          (parser<callbacks_proxy<mock_json_callbacks>_> *this,czstring src)

{
  size_t sVar1;
  ulong uVar2;
  parser<callbacks_proxy<mock_json_callbacks>_> *ppVar3;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_30;
  size_t local_20;
  size_t len;
  czstring src_local;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_local;
  
  len = (size_t)src;
  src_local = (czstring)this;
  sVar1 = strlen(src);
  local_20 = sVar1;
  uVar2 = std::numeric_limits<long>::max();
  if (sVar1 <= uVar2) {
    local_30 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               gsl::make_span<char_const>((char *)len,local_20);
    ppVar3 = parser<callbacks_proxy<mock_json_callbacks>>::input<pstore::gsl::span<char_const,_1l>>
                       ((parser<callbacks_proxy<mock_json_callbacks>> *)this,
                        (span<const_char,__1L> *)&local_30);
    return ppVar3;
  }
  assert_failed("len <= static_cast<std::make_unsigned_t<index_type>> ( std::numeric_limits<index_type>::max ())"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                ,0x99);
}

Assistant:

parser & input (gsl::czstring const src) {
                std::size_t const len = std::strlen (src);
                using index_type = gsl::span<char>::index_type;
                PSTORE_ASSERT (len <= static_cast<std::make_unsigned_t<index_type>> (
                                          std::numeric_limits<index_type>::max ()));
                return this->input (gsl::make_span (src, static_cast<index_type> (len)));
            }